

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall Lexer::copy_str(Lexer *this,string *dst,int32_t dst_index)

{
  pointer pcVar1;
  long *local_48 [2];
  long local_38 [2];
  
  pcVar1 = (this->code_ptr)._M_dataplus._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)local_48,pcVar1 + (this->current_index).index,pcVar1 + dst_index);
  std::__cxx11::string::operator=((string *)dst,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  (this->current_index).index = dst_index;
  return;
}

Assistant:

void Lexer::copy_str(string &dst, int32_t dst_index) {
//    if (!dst.length())return;
    dst = string(code_ptr.begin() + current_index.index, code_ptr.begin() + dst_index);
    current_index.index = dst_index;
}